

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall FConsoleCommand::FConsoleCommand(FConsoleCommand *this,char *name,CCmdRun runFunc)

{
  bool bVar1;
  char *pcVar2;
  uint local_3c;
  int ag;
  uint i;
  char tname [16];
  CCmdRun runFunc_local;
  char *name_local;
  FConsoleCommand *this_local;
  
  this->_vptr_FConsoleCommand = (_func_int **)&PTR__FConsoleCommand_00b69310;
  this->m_RunFunc = runFunc;
  if ((FConsoleCommand::firstTime & 1U) != 0) {
    FConsoleCommand::firstTime = false;
    for (local_3c = 0; local_3c < 0x20; local_3c = local_3c + 1) {
      strcpy((char *)((long)&ag + 1),ActionMaps[local_3c].Name);
      ag._0_1_ = 0x2b;
      C_AddTabCommand((char *)&ag);
      ag._0_1_ = 0x2d;
      C_AddTabCommand((char *)&ag);
    }
  }
  strcmp(name,"kill");
  pcVar2 = copystring(name);
  this->m_Name = pcVar2;
  bVar1 = AddToHash(this,Commands);
  if (bVar1) {
    C_AddTabCommand(name);
  }
  else {
    Printf("FConsoleCommand c\'tor: %s exists\n",name);
  }
  return;
}

Assistant:

FConsoleCommand::FConsoleCommand (const char *name, CCmdRun runFunc)
	: m_RunFunc (runFunc)
{
	static bool firstTime = true;

	if (firstTime)
	{
		char tname[16];
		unsigned int i;

		firstTime = false;

		// Add all the action commands for tab completion
		for (i = 0; i < NUM_ACTIONS; i++)
		{
			strcpy (&tname[1], ActionMaps[i].Name);
			tname[0] = '+';
			C_AddTabCommand (tname);
			tname[0] = '-';
			C_AddTabCommand (tname);
		}
	}

	int ag = strcmp (name, "kill");
	if (ag == 0)
		ag=0;
	m_Name = copystring (name);

	if (!AddToHash (Commands))
		Printf ("FConsoleCommand c'tor: %s exists\n", name);
	else
		C_AddTabCommand (name);
}